

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

uint8_t bcm2835_i2c_write(char *buf,uint32_t len)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint32_t *paddr;
  uint8_t uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  paddr = bcm2835_bsc1;
  puVar1 = bcm2835_bsc1 + 1;
  bcm2835_peri_set_bits(bcm2835_bsc1,0x20,0x20);
  if (debug == '\0') {
    *puVar1 = 0x302;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1,0x302);
  }
  if (debug == '\0') {
    paddr[2] = len;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr + 2,(ulong)len);
  }
  puVar2 = paddr + 4;
  if (len == 0) {
    uVar4 = 0;
    iVar6 = 0;
  }
  else {
    uVar5 = 0xf;
    if (len - 1 < 0xf) {
      uVar5 = len - 1;
    }
    uVar4 = 0;
    do {
      if (debug == '\0') {
        *puVar2 = (int)buf[uVar4];
      }
      else {
        printf("bcm2835_peri_write_nb paddr %p, value %08X\n",puVar2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 + 1 != uVar4);
    iVar6 = len - (int)uVar4;
  }
  if (debug == '\0') {
    *paddr = 0x8080;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr,0x8080);
  }
LAB_001030a0:
  do {
    do {
      if (debug == '\0') {
        if ((*puVar1 & 2) != 0) {
          uVar3 = '\x01';
          if (((*puVar1 >> 8 & 1) == 0) && (uVar3 = '\x02', (*puVar1 >> 9 & 1) == 0)) {
            uVar3 = (iVar6 != 0) << 2;
          }
          bcm2835_peri_set_bits(paddr,2,2);
          return uVar3;
        }
      }
      else {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
      }
    } while (iVar6 == 0);
    do {
      if (debug != '\0') {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
        goto LAB_001030a0;
      }
      if ((*puVar1 & 0x10) == 0) goto LAB_001030a0;
      *puVar2 = (int)buf[uVar4 & 0xffffffff];
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar6 = 0;
  } while( true );
}

Assistant:

uint8_t bcm2835_i2c_write(const char * buf, uint32_t len)
{
#ifdef I2C_V1
    volatile uint32_t* dlen    = bcm2835_bsc0 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc0 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc0 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc0 + BCM2835_BSC_C/4;
#else
    volatile uint32_t* dlen    = bcm2835_bsc1 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc1 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc1 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc1 + BCM2835_BSC_C/4;
#endif    

    uint32_t remaining = len;
    uint32_t i = 0;
    uint8_t reason = BCM2835_I2C_REASON_OK;

    /* Clear FIFO */
    bcm2835_peri_set_bits(control, BCM2835_BSC_C_CLEAR_1 , BCM2835_BSC_C_CLEAR_1 );
    /* Clear Status */
    bcm2835_peri_write(status, BCM2835_BSC_S_CLKT | BCM2835_BSC_S_ERR | BCM2835_BSC_S_DONE);
    /* Set Data Length */
    bcm2835_peri_write(dlen, len);
    /* pre populate FIFO with max buffer */
    while( remaining && ( i < BCM2835_BSC_FIFO_SIZE ) )
    {
        bcm2835_peri_write_nb(fifo, buf[i]);
        i++;
        remaining--;
    }
    
    /* Enable device and start transfer */
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST);
    
    /* Transfer is over when BCM2835_BSC_S_DONE */
    while(!(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE ))
    {
        while ( remaining && (bcm2835_peri_read(status) & BCM2835_BSC_S_TXD ))
    	{
	    /* Write to FIFO */
	    bcm2835_peri_write(fifo, buf[i]);
	    i++;
	    remaining--;
    	}
    }

    /* Received a NACK */
    if (bcm2835_peri_read(status) & BCM2835_BSC_S_ERR)
    {
	reason = BCM2835_I2C_REASON_ERROR_NACK;
    }

    /* Received Clock Stretch Timeout */
    else if (bcm2835_peri_read(status) & BCM2835_BSC_S_CLKT)
    {
	reason = BCM2835_I2C_REASON_ERROR_CLKT;
    }

    /* Not all data is sent */
    else if (remaining)
    {
	reason = BCM2835_I2C_REASON_ERROR_DATA;
    }

    bcm2835_peri_set_bits(control, BCM2835_BSC_S_DONE , BCM2835_BSC_S_DONE);

    return reason;
}